

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int iVar1;
  int iVar2;
  stbi__context *__src;
  uchar *data;
  int *piVar3;
  long lVar4;
  size_t __size;
  int *two_back;
  int iVar5;
  int iVar6;
  long lVar7;
  uchar *image;
  long in_FS_OFFSET;
  size_t local_89a0;
  stbi__context s;
  stbi__gif local_88a0;
  
  s.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  s.read_from_callbacks = 0;
  s.callback_already_read = 0;
  s.img_buffer_end = buffer + len;
  two_back = y;
  s.img_buffer = buffer;
  s.img_buffer_original = buffer;
  s.img_buffer_original_end = s.img_buffer_end;
  iVar2 = stbi__gif_test(&s);
  if (iVar2 == 0) {
    *(char **)(in_FS_OFFSET + -0x10) = "not GIF";
    data = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_89a0 = 4;
    lVar4 = 0;
    data = (uchar *)0x0;
    lVar7 = 0;
    while( true ) {
      __src = (stbi__context *)
              stbi__gif_load_next(&s,&local_88a0,comp,(int)lVar7,(stbi_uc *)two_back);
      iVar2 = (int)lVar4;
      if ((__src == &s) || (__src == (stbi__context *)0x0)) break;
      *x = local_88a0.w;
      *y = local_88a0.h;
      iVar5 = local_88a0.h * local_88a0.w;
      iVar1 = iVar5 * 4;
      __size = (size_t)((iVar2 + 1) * iVar1);
      if (data == (uchar *)0x0) {
        data = (uchar *)malloc(__size);
        if (delays != (int **)0x0) {
          piVar3 = (int *)malloc(local_89a0);
LAB_0012e066:
          *delays = piVar3;
        }
      }
      else {
        data = (uchar *)realloc(data,__size);
        if (data == (uchar *)0x0) {
          free(local_88a0.out);
          free(local_88a0.history);
          free(local_88a0.background);
          *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
          data = (uchar *)0x0;
          goto LAB_0012e16b;
        }
        if (delays != (int **)0x0) {
          piVar3 = (int *)realloc(*delays,local_89a0);
          goto LAB_0012e066;
        }
      }
      memcpy(data + iVar2 * iVar1,__src,(long)iVar1);
      if (lVar4 != 0) {
        lVar7 = (long)data - (long)(iVar5 * 8);
      }
      if (delays != (int **)0x0) {
        (*delays)[lVar4] = local_88a0.delay;
      }
      local_89a0 = local_89a0 + 4;
      lVar4 = lVar4 + 1;
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      data = stbi__convert_format(data,4,req_comp,local_88a0.w * iVar2,local_88a0.h);
    }
    *z = iVar2;
  }
LAB_0012e16b:
  iVar2 = stbi__vertically_flip_on_load_global;
  if (*(int *)(in_FS_OFFSET + -4) != 0) {
    iVar2 = *(int *)(in_FS_OFFSET + -8);
  }
  if (iVar2 != 0) {
    iVar2 = *x;
    iVar1 = *y;
    iVar5 = *comp;
    image = data;
    iVar6 = 0;
    if (0 < *z) {
      iVar6 = *z;
    }
    while (iVar6 != 0) {
      stbi__vertical_flip(image,iVar2,iVar1,iVar5);
      image = image + iVar1 * iVar2 * iVar5;
      iVar6 = iVar6 + -1;
    }
  }
  return data;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}